

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  ImGuiStyleMod *pIVar4;
  ImGuiContext *pIVar5;
  float *pfVar6;
  ImGuiStyleMod *__dest;
  int iVar7;
  int iVar8;
  
  pIVar5 = GImGui;
  pfVar6 = GetStyleVarFloatAddr(idx);
  if (pfVar6 != (float *)0x0) {
    fVar2 = *pfVar6;
    iVar8 = (pIVar5->StyleModifiers).Size;
    iVar3 = (pIVar5->StyleModifiers).Capacity;
    if (iVar8 == iVar3) {
      iVar8 = iVar8 + 1;
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar3 < iVar8) {
        piVar1 = &(pIVar5->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (ImGuiStyleMod *)(*(pIVar5->IO).MemAllocFn)((long)iVar8 * 0xc);
        pIVar4 = (pIVar5->StyleModifiers).Data;
        if (pIVar4 != (ImGuiStyleMod *)0x0) {
          memcpy(__dest,pIVar4,(long)(pIVar5->StyleModifiers).Size * 0xc);
        }
        pIVar4 = (pIVar5->StyleModifiers).Data;
        if (pIVar4 != (ImGuiStyleMod *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar4);
        (pIVar5->StyleModifiers).Data = __dest;
        (pIVar5->StyleModifiers).Capacity = iVar8;
      }
    }
    pIVar4 = (pIVar5->StyleModifiers).Data;
    iVar8 = (pIVar5->StyleModifiers).Size;
    (pIVar5->StyleModifiers).Size = iVar8 + 1;
    pIVar4[iVar8].Var = idx;
    pIVar4[iVar8].PreviousValue.x = fVar2;
    pIVar4[iVar8].PreviousValue.y = 0.0;
    *pfVar6 = val;
    return;
  }
  __assert_fail("pvar != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                ,0x124d,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    ImGuiContext& g = *GImGui;
    float* pvar = GetStyleVarFloatAddr(idx);
    IM_ASSERT(pvar != NULL); // Called function with wrong-type? Variable is not a float.
    ImGuiStyleMod backup;
    backup.Var = idx;
    backup.PreviousValue = ImVec2(*pvar, 0.0f);
    g.StyleModifiers.push_back(backup);
    *pvar = val;
}